

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ipc::HostImpl::OnInvokeMethod(HostImpl *this,ClientConnection *client,Frame *req_frame)

{
  uint uVar1;
  pid_t pVar2;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false> _Var3;
  uint64_t value;
  _Base_ptr p_Var4;
  long lVar5;
  ClientID CVar6;
  code *pcVar7;
  long *plVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  IPCFrame_InvokeMethodReply *this_00;
  iterator iVar10;
  long lVar11;
  long *local_160;
  WeakPtr<perfetto::ipc::HostImpl> host_weak_ptr;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  Deferred<protozero::CppMessageObj> deferred_reply;
  __shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2> local_108;
  ClientID local_f8;
  uint64_t uStack_f0;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  DeferredBase local_c8;
  Frame reply_frame;
  
  _Var3._M_head_impl =
       (req_frame->msg_invoke_method_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false>._M_head_impl;
  protos::gen::IPCFrame::IPCFrame(&reply_frame);
  value = req_frame->request_id_;
  protos::gen::IPCFrame::set_request_id(&reply_frame,value);
  this_00 = protos::gen::IPCFrame::mutable_msg_invoke_method_reply(&reply_frame);
  protos::gen::IPCFrame_InvokeMethodReply::set_success(this_00,false);
  deferred_reply.super_DeferredBase.callback_.super__Function_base._M_functor._0_4_ =
       (_Var3._M_head_impl)->service_id_;
  iVar10 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>,_std::_Select1st<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>_>
           ::find(&(this->services_)._M_t,(key_type_conflict1 *)&deferred_reply);
  if ((_Rb_tree_header *)iVar10._M_node == &(this->services_)._M_t._M_impl.super__Rb_tree_header) {
    SendFrame(client,&reply_frame,-1);
  }
  else {
    p_Var4 = iVar10._M_node[2]._M_left;
    lVar11 = (**(code **)(*(long *)p_Var4 + 0x10))(p_Var4);
    uVar1 = (_Var3._M_head_impl)->method_id_;
    if (((ulong)uVar1 == 0) ||
       (lVar5 = *(long *)(lVar11 + 8), (ulong)(*(long *)(lVar11 + 0x10) - lVar5 >> 5) < (ulong)uVar1
       )) {
      SendFrame(client,&reply_frame,-1);
    }
    else {
      lVar11 = (ulong)(uVar1 - 1) * 0x20;
      (**(code **)(lVar5 + 8 + lVar11))(&local_160,&(_Var3._M_head_impl)->args_proto_);
      if (local_160 == (long *)0x0) {
        SendFrame(client,&reply_frame,-1);
      }
      else {
        local_e8._M_unused._M_object = (void *)0x0;
        local_e8._8_8_ = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        Deferred<protozero::CppMessageObj>::Deferred
                  (&deferred_reply,
                   (function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                   &local_e8);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
        std::__shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
                   &host_weak_ptr,
                   (__shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->weak_ptr_factory_);
        if ((_Var3._M_head_impl)->drop_reply_ == false) {
          CVar6 = client->id;
          std::__shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_108,
                     (__shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
                     &host_weak_ptr);
          local_148._M_unused._M_object = (void *)0x0;
          local_148._8_8_ = 0;
          local_138 = (code *)0x0;
          pcStack_130 = (code *)0x0;
          local_f8 = CVar6;
          uStack_f0 = value;
          local_148._M_unused._M_object = operator_new(0x20);
          _Var9._M_pi = local_108._M_refcount._M_pi;
          local_108._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)local_148._M_unused._0_8_ = local_108._M_ptr;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_148._M_unused._0_8_ + 8) =
               _Var9._M_pi;
          local_108._M_ptr = (element_type *)0x0;
          *(ClientID *)((long)local_148._M_unused._0_8_ + 0x10) = local_f8;
          *(uint64_t *)((long)local_148._M_unused._0_8_ + 0x18) = uStack_f0;
          pcStack_130 = std::
                        _Function_handler<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:70303:25)>
                        ::_M_invoke;
          local_138 = std::
                      _Function_handler<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:70303:25)>
                      ::_M_manager;
          Deferred<protozero::CppMessageObj>::Bind
                    (&deferred_reply,
                     (function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                     &local_148);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_148);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
        }
        uVar1 = ((client->sock)._M_t.
                 super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                 .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->
                peer_uid_;
        base::CrashKey::Set((CrashKey *)(anonymous_namespace)::g_crash_key_uid,(ulong)uVar1);
        plVar8 = local_160;
        pVar2 = ((client->sock)._M_t.
                 super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                 .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->
                peer_pid_;
        p_Var4->_M_parent = (_Base_ptr)client->id;
        *(uint *)&p_Var4->_M_left = uVar1;
        *(pid_t *)((long)&p_Var4->_M_left + 4) = pVar2;
        p_Var4->_M_right = (_Base_ptr)&client->received_fd;
        pcVar7 = *(code **)(lVar5 + lVar11 + 0x18);
        DeferredBase::DeferredBase(&local_c8,&deferred_reply.super_DeferredBase);
        (*pcVar7)(p_Var4,plVar8,&local_c8);
        DeferredBase::~DeferredBase(&local_c8);
        p_Var4->_M_right = (_Base_ptr)0x0;
        p_Var4->_M_parent = (_Base_ptr)0x0;
        p_Var4->_M_left = (_Base_ptr)0xffffffffffffffff;
        (anonymous_namespace)::g_crash_key_uid._16_8_ = 0;
        (anonymous_namespace)::g_crash_key_uid[1] = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&host_weak_ptr.handle_.
                    super___shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        DeferredBase::~DeferredBase(&deferred_reply.super_DeferredBase);
      }
      if (local_160 != (long *)0x0) {
        (**(code **)(*local_160 + 8))();
      }
    }
  }
  protos::gen::IPCFrame::~IPCFrame(&reply_frame);
  return;
}

Assistant:

void HostImpl::OnInvokeMethod(ClientConnection* client,
                              const Frame& req_frame) {
  const Frame::InvokeMethod& req = req_frame.msg_invoke_method();
  Frame reply_frame;
  RequestID request_id = req_frame.request_id();
  reply_frame.set_request_id(request_id);
  reply_frame.mutable_msg_invoke_method_reply()->set_success(false);
  auto svc_it = services_.find(req.service_id());
  if (svc_it == services_.end())
    return SendFrame(client, reply_frame);  // |success| == false by default.

  Service* service = svc_it->second.instance.get();
  const ServiceDescriptor& svc = service->GetDescriptor();
  const auto& methods = svc.methods;
  const uint32_t method_id = req.method_id();
  if (method_id == 0 || method_id > methods.size())
    return SendFrame(client, reply_frame);

  const ServiceDescriptor::Method& method = methods[method_id - 1];
  std::unique_ptr<ProtoMessage> decoded_req_args(
      method.request_proto_decoder(req.args_proto()));
  if (!decoded_req_args)
    return SendFrame(client, reply_frame);

  Deferred<ProtoMessage> deferred_reply;
  base::WeakPtr<HostImpl> host_weak_ptr = weak_ptr_factory_.GetWeakPtr();
  ClientID client_id = client->id;

  if (!req.drop_reply()) {
    deferred_reply.Bind([host_weak_ptr, client_id,
                         request_id](AsyncResult<ProtoMessage> reply) {
      if (!host_weak_ptr)
        return;  // The reply came too late, the HostImpl has gone.
      host_weak_ptr->ReplyToMethodInvocation(client_id, request_id,
                                             std::move(reply));
    });
  }

  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));
  service->client_info_ =
      ClientInfo(client->id, peer_uid, GetLinuxPeerPid(client->sock.get()));
  service->received_fd_ = &client->received_fd;
  method.invoker(service, *decoded_req_args, std::move(deferred_reply));
  service->received_fd_ = nullptr;
  service->client_info_ = ClientInfo();
}